

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editorsmodel.cpp
# Opt level: O3

bool __thiscall EditorsModel::isEmpty(EditorsModel *this)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  anon_union_24_3_e3d07ef4_for_data local_98;
  QArrayData *local_78;
  long local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 local_48 [24];
  
  local_98._forAlignment = -NAN;
  local_98._8_8_ = 0;
  local_98._16_8_ = 0;
  iVar2 = (**(code **)(*(long *)this + 0x78))();
  if (0 < iVar2) {
    iVar2 = 0;
    do {
      local_98._forAlignment = -NAN;
      local_98._8_8_ = 0;
      local_98._16_8_ = 0;
      iVar3 = (**(code **)(*(long *)this + 0x80))(this,&local_98);
      if (0 < iVar3) {
        iVar3 = 0;
        do {
          local_60 = 0xffffffffffffffff;
          local_58 = 0;
          uStack_50 = 0;
          (**(code **)(*(long *)this + 0x60))(local_48,this,iVar2,iVar3,&local_60);
          (**(code **)(*(long *)this + 0x90))(&local_98,this,local_48);
          QVariant::toString();
          lVar1 = local_68;
          if (local_78 != (QArrayData *)0x0) {
            LOCK();
            (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_78,2,8);
            }
          }
          QVariant::~QVariant((QVariant *)&local_98);
          if (lVar1 != 0) {
            return false;
          }
          iVar3 = iVar3 + 1;
          local_98._forAlignment = -NAN;
          local_98._8_8_ = 0;
          local_98._16_8_ = 0;
          iVar4 = (**(code **)(*(long *)this + 0x80))(this,&local_98);
        } while (iVar3 < iVar4);
      }
      iVar2 = iVar2 + 1;
      local_98._forAlignment = -NAN;
      local_98._8_8_ = 0;
      local_98._16_8_ = 0;
      iVar3 = (**(code **)(*(long *)this + 0x78))(this,&local_98);
    } while (iVar2 < iVar3);
  }
  return true;
}

Assistant:

bool EditorsModel::isEmpty() const
{
    for(int r=0;r<rowCount();r++) {
        for (int c=0;c<columnCount();c++) {
            if (!data(index(r,c)).toString().isEmpty()) {
                return false;
            }
        }
    }
    return true;
}